

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O0

bool diligent_spirv_cross::is_valid_spirv_version(uint32_t version)

{
  bool local_9;
  uint32_t version_local;
  
  if (((((version == 99) || (version == 0x10000)) || (version == 0x10100)) ||
      ((version == 0x10200 || (version == 0x10300)))) ||
     ((version == 0x10400 || ((version == 0x10500 || (version == 0x10600)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool is_valid_spirv_version(uint32_t version)
{
	switch (version)
	{
	// Allow v99 since it tends to just work.
	case 99:
	case 0x10000: // SPIR-V 1.0
	case 0x10100: // SPIR-V 1.1
	case 0x10200: // SPIR-V 1.2
	case 0x10300: // SPIR-V 1.3
	case 0x10400: // SPIR-V 1.4
	case 0x10500: // SPIR-V 1.5
	case 0x10600: // SPIR-V 1.6
		return true;

	default:
		return false;
	}
}